

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

HashBlock *
compress(HashBlock *__return_storage_ptr__,
        vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
        *m)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pvVar3;
  ExpansionBlock EVar4;
  ExpansionBlock EVar5;
  ExpansionBlock EVar6;
  ExpansionBlock EVar7;
  undefined8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  ExpansionBlockVec mi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  ulong local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong auStack_250 [2];
  ulong *local_240;
  long local_238;
  ulong local_230;
  undefined8 uStack_228;
  ulong *local_220;
  long local_218;
  ulong local_210;
  undefined8 uStack_208;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  undefined8 uStack_1e8;
  ulong *local_1e0;
  long local_1d8;
  ulong local_1d0;
  undefined8 uStack_1c8;
  ulong *local_1c0;
  long local_1b8;
  ulong local_1b0;
  undefined8 uStack_1a8;
  ulong *local_1a0;
  long local_198;
  ulong local_190;
  undefined8 uStack_188;
  bitset<256ul> *local_180;
  ulong local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  *local_70;
  ulong local_68;
  ulong local_60;
  _Base_bitset<1UL> local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_258 = 0x1f83d9ab;
  auStack_250[0] = 0x5be0cd19;
  local_268 = 0x510e527f;
  uStack_260 = 0x9b05688c;
  local_278 = 0x3c6ef372;
  uStack_270 = 0xa54ff53a;
  local_288 = 0x6a09e667;
  uStack_280 = 0xbb67ae85;
  pvVar3 = (m->
           super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_180 = (bitset<256ul> *)__return_storage_ptr__;
  local_70 = m;
  if ((m->
      super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar3) {
    uVar10 = 0;
    do {
      local_68 = uVar10;
      std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::vector
                ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)&local_2a8,
                 pvVar3 + uVar10);
      local_178 = uStack_260 & 0xffffffff;
      lVar14 = 0;
      uVar10 = local_258;
      uVar9 = local_288;
      uVar13 = uStack_280 & 0xffffffff;
      uVar15 = local_268;
      uVar16 = uStack_270;
      uVar17 = auStack_250[0];
      uVar18 = local_278;
      do {
        local_48 = local_178;
        local_178 = uVar15;
        local_50 = uVar9;
        local_40 = lVar14;
        local_38 = uVar10;
        local_58._M_w = (_WordT)big_sigma0((ExpansionBlock)(uVar9 & 0xffffffff));
        EVar4 = maj((ExpansionBlock)(uVar9 & 0xffffffff),(ExpansionBlock)(uVar13 & 0xffffffff),
                    (ExpansionBlock)(uVar18 & 0xffffffff));
        EVar5.super__Base_bitset<1UL>._M_w._0_4_ = (int)uVar16 + (int)uVar18;
        EVar5.super__Base_bitset<1UL>._M_w._4_4_ = 0;
        local_60 = uVar18;
        EVar5 = big_sigma2(EVar5);
        EVar7.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(local_178 & 0xffffffff);
        EVar6 = big_sigma1(EVar7);
        uVar18 = local_38;
        iVar11 = (int)local_38;
        EVar7 = ch(EVar7,(ExpansionBlock)(local_48 & 0xffffffff),
                   (ExpansionBlock)(local_38 & 0xffffffff));
        lVar14 = (long)EVar4.super__Base_bitset<1UL>._M_w + local_58._M_w +
                 (long)EVar5.super__Base_bitset<1UL>._M_w;
        uVar15 = lVar14 + local_60;
        uVar9 = lVar14 * 3 -
                (uVar17 + (long)EVar6.super__Base_bitset<1UL>._M_w +
                 (long)EVar7.super__Base_bitset<1UL>._M_w + *(long *)(&DAT_001060e0 + local_40) +
                *(long *)(local_2a8._M_dataplus._M_p + local_40));
        lVar14 = local_40 + 8;
        uVar10 = local_178;
        uVar13 = local_50;
        uVar16 = local_60;
        uVar17 = uVar18;
        uVar18 = local_50;
      } while (lVar14 != 0x200);
      local_288 = uVar9 + local_288 & 0xffffffff;
      uStack_280 = local_50 + uStack_280 & 0xffffffff;
      local_278 = (ulong)(uint)((int)local_50 + (int)local_278);
      uStack_270 = uStack_270 + local_60 & 0xffffffff;
      local_268 = local_268 + uVar15 & 0xffffffff;
      auVar19._8_4_ = (int)local_178;
      auVar19._0_8_ = local_178;
      auVar19._12_4_ = (int)(local_178 >> 0x20);
      uStack_260 = local_178 + uStack_260 & 0xffffffff;
      local_258 = auVar19._8_8_ + local_258 & 0xffffffff;
      auStack_250[0] = (ulong)(uint)(iVar11 + (int)auStack_250[0]);
      operator_delete(local_2a8._M_dataplus._M_p,
                      local_2a8.field_2._M_allocated_capacity - (long)local_2a8._M_dataplus._M_p);
      uVar10 = local_68 + 1;
      pvVar3 = (local_70->
               super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)(local_70->
                     super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
              -0x5555555555555555;
    } while (uVar10 <= uVar9 && uVar9 - uVar10 != 0);
  }
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_90,(bitset<32ul> *)&local_288);
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_b0,(bitset<32ul> *)&uStack_280);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    uVar12 = local_90.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_b0._M_string_length + local_90._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar12 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_b0._M_string_length + local_90._M_string_length) goto LAB_001040d9;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
  }
  else {
LAB_001040d9:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
  }
  local_240 = &local_230;
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_230 = *puVar1;
    uStack_228 = puVar8[3];
  }
  else {
    local_230 = *puVar1;
    local_240 = (ulong *)*puVar8;
  }
  local_238 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_d0,(bitset<32ul> *)&local_278);
  uVar10 = 0xf;
  if (local_240 != &local_230) {
    uVar10 = local_230;
  }
  if (uVar10 < local_d0._M_string_length + local_238) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar12 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_d0._M_string_length + local_238) goto LAB_001041a8;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_240);
  }
  else {
LAB_001041a8:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_240,(ulong)local_d0._M_dataplus._M_p);
  }
  local_220 = &local_210;
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_210 = *puVar1;
    uStack_208 = puVar8[3];
  }
  else {
    local_210 = *puVar1;
    local_220 = (ulong *)*puVar8;
  }
  local_218 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_f0,(bitset<32ul> *)&uStack_270);
  uVar10 = 0xf;
  if (local_220 != &local_210) {
    uVar10 = local_210;
  }
  if (uVar10 < local_f0._M_string_length + local_218) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar12 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_f0._M_string_length + local_218) goto LAB_00104286;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_220);
  }
  else {
LAB_00104286:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_f0._M_dataplus._M_p);
  }
  local_200 = &local_1f0;
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_1f0 = *puVar1;
    uStack_1e8 = puVar8[3];
  }
  else {
    local_1f0 = *puVar1;
    local_200 = (ulong *)*puVar8;
  }
  local_1f8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_110,(bitset<32ul> *)&local_268);
  uVar10 = 0xf;
  if (local_200 != &local_1f0) {
    uVar10 = local_1f0;
  }
  if (uVar10 < local_110._M_string_length + local_1f8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar12 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_110._M_string_length + local_1f8) goto LAB_00104369;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_200);
  }
  else {
LAB_00104369:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_200,(ulong)local_110._M_dataplus._M_p);
  }
  local_1e0 = &local_1d0;
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_1d0 = *puVar1;
    uStack_1c8 = puVar8[3];
  }
  else {
    local_1d0 = *puVar1;
    local_1e0 = (ulong *)*puVar8;
  }
  local_1d8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_130,(bitset<32ul> *)&uStack_260);
  uVar10 = 0xf;
  if (local_1e0 != &local_1d0) {
    uVar10 = local_1d0;
  }
  if (uVar10 < local_130._M_string_length + local_1d8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar12 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_130._M_string_length + local_1d8) goto LAB_0010444a;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_1e0);
  }
  else {
LAB_0010444a:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_130._M_dataplus._M_p);
  }
  local_1c0 = &local_1b0;
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_1b0 = *puVar1;
    uStack_1a8 = puVar8[3];
  }
  else {
    local_1b0 = *puVar1;
    local_1c0 = (ulong *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_150,(bitset<32ul> *)&local_258);
  uVar10 = 0xf;
  if (local_1c0 != &local_1b0) {
    uVar10 = local_1b0;
  }
  if (uVar10 < local_150._M_string_length + local_1b8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar12 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_150._M_string_length + local_1b8) goto LAB_0010452b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_1c0);
  }
  else {
LAB_0010452b:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_150._M_dataplus._M_p);
  }
  local_1a0 = &local_190;
  puVar1 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar1) {
    local_190 = *puVar1;
    uStack_188 = puVar8[3];
  }
  else {
    local_190 = *puVar1;
    local_1a0 = (ulong *)*puVar8;
  }
  local_198 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::bitset<32ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_170,(bitset<32ul> *)auStack_250);
  uVar10 = 0xf;
  if (local_1a0 != &local_190) {
    uVar10 = local_190;
  }
  if (uVar10 < local_170._M_string_length + local_198) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      uVar12 = local_170.field_2._M_allocated_capacity;
    }
    if (local_170._M_string_length + local_198 <= (ulong)uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_1a0);
      goto LAB_0010462c;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_170._M_dataplus._M_p);
LAB_0010462c:
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar2) {
    local_2a8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_2a8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_2a8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_2a8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2a8._M_string_length = puVar8[1];
  *puVar8 = paVar2;
  puVar8[1] = 0;
  paVar2->_M_local_buf[0] = '\0';
  std::bitset<256ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
            (local_180,&local_2a8,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,local_1d0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return (HashBlock *)local_180;
}

Assistant:

HashBlock compress(std::vector<ExpansionBlockVec> m)
{

    Prime a, b, c, d, e, f, g, h;

    Prime ks[] = {
            0x428a2f98,         // K0
            0x71374491,         // K1
            0xb5c0fbcf,         // K2
            0xe9b5dba5,         // K3
            0x3956c25b,         // K4
            0x59f111f1,         // K5
            0x923f82a4,         // K6
            0xab1c5ed5,         // K7
            0xd807aa98,         // K8
            0x12835b01,         // K9
            0x243185be,         // K10
            0x550c7dc3,         // K11
            0x72be5d74,         // K12
            0x80deb1fe,         // K13
            0x9bdc06a7,         // K14
            0xc19bf174,         // K15
            0xe49b69c1,         // K16
            0xefbe4786,         // K17
            0x0fc19dc6,         // K18
            0x240ca1cc,         // K19
            0x2de92c6f,         // K20
            0x4a7484aa,         // K21
            0x5cb0a9dc,         // K22
            0x76f988da,         // K23
            0x983e5152,         // K24
            0xa831c66d,         // K25
            0xb00327c8,         // K26
            0xbf597fc7,         // K27
            0xc6e00bf3,         // K28
            0xd5a79147,         // K29
            0x06ca6351,         // K30
            0x14292967,         // K31
            0x27b70a85,         // K32
            0x2e1b2138,         // K33
            0x4d2c6dfc,         // K34
            0x53380d13,         // K35
            0x650a7354,         // K36
            0x766a0abb,         // K37
            0x81c2c92e,         // K38
            0x92722c85,         // K39
            0xa2bfe8a1,         // K40
            0xa81a664b,         // K41
            0xc24b8b70,         // K42
            0xc76c51a3,         // K43
            0xd192e819,         // K44
            0xd6990624,         // K45
            0xf40e3585,         // K46
            0x106aa070,         // K47
            0x19a4c116,         // K48
            0x1e376c08,         // K49
            0x2748774c,         // K50
            0x34b0bcb5,         // K51
            0x391c0cb3,         // K52
            0x4ed8aa4a,         // K53
            0x5b9cca4f,         // K54
            0x682e6ff3,         // K55
            0x748f82ee,         // K56
            0x78a5636f,         // K57
            0x84c87814,         // K58
            0x8cc70208,         // K59
            0x90befffa,         // K60
            0xa4506ceb,         // K61
            0xbe49a3f7,         // K62
            0xc67178f2,         // K63
    };
    HashBlockSegment hs[] = {
            0x6a09e667,         // H(0, 0)
            0xbb67ae85,         // H(0, 1)
            0x3c6ef372,         // H(0, 2)
            0xa54ff53a,         // H(0, 3)
            0x510e527f,         // H(0, 4)
            0x9b05688c,         // H(0, 5)
            0x1f83d9ab,         // H(0, 6)
            0x5be0cd19          // H(0, 7)
    };


    // Iterate over all expansion blocks
    for (int i = 0; i < m.size(); ++i)
    {
        ExpansionBlockVec mi = m[i];
        a = hs[0].to_ulong();
        b = hs[1].to_ulong();
        c = hs[2].to_ulong();
        d = hs[3].to_ulong();
        e = hs[4].to_ulong();
        f = hs[5].to_ulong();
        g = hs[6].to_ulong();
        h = hs[7].to_ulong();

        for (int j = 0; j < EXPANSION_BLOCK_COUNT_IN_SET; ++j)
        {
            Prime t1 = big_sigma0(a).to_ulong() + maj(a, b, c).to_ulong() + big_sigma2(c + d).to_ulong();
            Prime t2 = h + big_sigma1(e).to_ulong() + ch(e, f, g).to_ulong() + ks[j] + mi[j].to_ulong();

            h = g;
            f = e;
            d = c;
            b = a;
            g = f;
            e = d + t1;
            c = b;
            a = 3 * t1 - t2;
        }

        hs[0] = a + hs[0].to_ulong();
        hs[1] = b + hs[1].to_ulong();
        hs[2] = c + hs[2].to_ulong();
        hs[3] = d + hs[3].to_ulong();
        hs[4] = e + hs[4].to_ulong();
        hs[5] = f + hs[5].to_ulong();
        hs[6] = g + hs[6].to_ulong();
        hs[7] = h + hs[7].to_ulong();
    }
    HashBlock result(
            hs[0].to_string() +
            hs[1].to_string() +
            hs[2].to_string() +
            hs[3].to_string() +
            hs[4].to_string() +
            hs[5].to_string() +
            hs[6].to_string() +
            hs[7].to_string()
    );

    return result;
}